

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O3

configuration configuration_object_initialize(char *name,char *path,configuration parent)

{
  configuration config;
  FILE *__stream;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  set psVar4;
  char *__dest;
  undefined8 uVar5;
  
  config = (configuration)malloc(0x30);
  if (config == (configuration)0x0) {
    log_write_impl_va("metacall",0x7e,"configuration_object_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                      ,3,"Invalid configuration object allocation");
    return (configuration)0x0;
  }
  if (path == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
LAB_00102da2:
      free(config);
      return (configuration)0x0;
    }
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    fseek(__stream,0,0);
    pcVar2 = (char *)malloc(sVar1 + 1);
    if (pcVar2 == (char *)0x0) {
      log_write_impl_va("metacall",0x5d,"configuration_object_read",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                        ,3,"Invalid configuration file stream allocation");
      fclose(__stream);
      goto LAB_00102da2;
    }
    sVar3 = fread(pcVar2,1,sVar1,__stream);
    fclose(__stream);
    if (sVar3 != sVar1) {
      log_write_impl_va("metacall",0x6a,"configuration_object_read",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                        ,3,"Invalid configuration file size read (%u != %u)",sVar3,sVar1);
      free(pcVar2);
      goto LAB_00102da2;
    }
    pcVar2[sVar1] = '\0';
  }
  config->source = pcVar2;
  sVar1 = strlen(name);
  pcVar2 = (char *)malloc(sVar1 + 1);
  config->name = pcVar2;
  psVar4 = (set)set_create(hash_callback_str,comparable_callback_str);
  config->map = psVar4;
  if (path == (char *)0x0) {
    config->path = (char *)0x0;
    __dest = (char *)0x0;
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(path);
    sVar3 = sVar3 + 1;
    __dest = (char *)malloc(sVar3);
    config->path = __dest;
    if (__dest == (char *)0x0) {
      uVar5 = 0xa1;
      goto LAB_00102cb4;
    }
  }
  if (psVar4 != (set)0x0 && pcVar2 != (char *)0x0) {
    memcpy(pcVar2,name,sVar1 + 1);
    if (sVar3 != 0 && __dest != (char *)0x0) {
      memcpy(__dest,path,sVar3);
    }
    config->parent = parent;
    if (parent != (configuration)0x0) {
      set_iterate(parent->map,configuration_object_initialize_cb_iterate,psVar4);
    }
    config->v = (value)0x0;
    return config;
  }
  uVar5 = 0xaf;
LAB_00102cb4:
  log_write_impl_va("metacall",uVar5,"configuration_object_initialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                    ,3,"Invalid configuration object initialization");
  configuration_object_destroy(config);
  return (configuration)0x0;
}

Assistant:

configuration configuration_object_initialize(const char *name, const char *path, configuration parent)
{
	configuration config = malloc(sizeof(struct configuration_type));

	size_t name_size, path_size = 0;

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object allocation");

		return NULL;
	}

	if (path != NULL)
	{
		config->source = configuration_object_read(path);

		if (config->source == NULL)
		{
			free(config);

			return NULL;
		}
	}
	else
	{
		config->source = NULL;
	}

	name_size = strlen(name) + 1;

	config->name = malloc(name_size * sizeof(char));

	config->map = set_create(&hash_callback_str, &comparable_callback_str);

	if (path != NULL)
	{
		path_size = strlen(path) + 1;

		config->path = malloc(path_size * sizeof(char));

		if (config->path == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object initialization");

			configuration_object_destroy(config);

			return NULL;
		}
	}
	else
	{
		config->path = NULL;
	}

	if (config->name == NULL || config->map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object initialization");

		configuration_object_destroy(config);

		return NULL;
	}

	memcpy(config->name, name, name_size);

	if (config->path && path_size > 0)
	{
		memcpy(config->path, path, path_size);
	}

	config->parent = parent;

	if (config->parent != NULL)
	{
		set_iterate(config->parent->map, &configuration_object_initialize_cb_iterate, config->map);
	}

	config->v = NULL;

	return config;
}